

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O3

void __thiscall PrintfTest_Examples_Test::TestBody(PrintfTest_Examples_Test *this)

{
  FILE *__s;
  bool bVar1;
  int iVar2;
  AssertionResult *pAVar3;
  _func_int **pp_Var4;
  char *message;
  AssertionResult gtest_ar;
  OutputRedirect gtest_redir;
  string gtest_expected_output;
  string gtest_output;
  AssertionResult local_2e8;
  OutputRedirect local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  local_2a8;
  undefined1 local_270 [32];
  char local_250 [504];
  char *local_58 [2];
  char *local_48;
  undefined8 local_38;
  
  testing::AssertionSuccess();
  if (local_2e8.success_ == true) {
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"Thursday, 21 August","");
    OutputRedirect::OutputRedirect(&local_2d8,(FILE *)_stdout);
    bVar1 = testing::internal::AlwaysTrue();
    __s = _stdout;
    if (bVar1) {
      local_2a8.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .args_.field_1.values_ =
           (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
            *)local_58;
      local_58[0] = "Thursday";
      local_48 = "August";
      local_38 = 0x15;
      local_270._16_8_ = 0;
      local_270._0_8_ = &PTR_grow_0023bf40;
      local_270._24_8_ = 500;
      local_2a8.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_ = "%1$s, %3$d %2$s";
      local_2a8.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.size_ = 0xf;
      local_2a8.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.next_arg_id_ = 0;
      local_2a8.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .out_.container = (basic_buffer<char> *)local_270;
      local_2a8.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .args_.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,char_const*,char_const*,int>
           ::TYPES;
      local_2a8.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .loc_.locale_ = (void *)0x0;
      local_270._8_8_ = local_250;
      fmt::v5::
      basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
      ::format(&local_2a8);
      fwrite((void *)local_270._8_8_,1,local_270._16_8_,__s);
      local_270._0_8_ = &PTR_grow_0023bf40;
      if ((char *)local_270._8_8_ != local_250) {
        operator_delete((void *)local_270._8_8_);
      }
    }
    OutputRedirect::restore_and_read_abi_cxx11_((string *)local_270,&local_2d8);
    pp_Var4 = (_func_int **)local_270._0_8_;
    if (local_270._8_8_ == local_2c8._M_string_length) {
      bVar1 = true;
      if ((char *)local_270._8_8_ != (char *)0x0) {
        iVar2 = bcmp((void *)local_270._0_8_,local_2c8._M_dataplus._M_p,local_270._8_8_);
        if (iVar2 != 0) goto LAB_0012bb19;
      }
    }
    else {
LAB_0012bb19:
      pAVar3 = testing::AssertionResult::operator<<
                         (&local_2e8,
                          (char (*) [80])
                          "fmt::printf(\"%1$s, %3$d %2$s\", weekday, month, day) produces different output.\n"
                         );
      pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [11])0x208855);
      pAVar3 = testing::AssertionResult::operator<<(pAVar3,&local_2c8);
      pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [2])0x208f1f);
      pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [11])0x208849);
      testing::AssertionResult::operator<<
                (pAVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_270);
      bVar1 = false;
      pp_Var4 = (_func_int **)local_270._0_8_;
    }
    if (pp_Var4 != (_func_int **)(local_270 + 0x10)) {
      operator_delete(pp_Var4);
    }
    OutputRedirect::~OutputRedirect(&local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    if (bVar1) goto LAB_0012bc23;
  }
  testing::Message::Message((Message *)local_270);
  if (local_2e8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((local_2e8.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_2a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
             ,0x1e8,message);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a8,(Message *)local_270);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a8);
  if ((_func_int **)local_270._0_8_ != (_func_int **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((_func_int **)local_270._0_8_ != (_func_int **)0x0)) {
      (**(code **)(*(_func_int **)local_270._0_8_ + 8))();
    }
  }
LAB_0012bc23:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2e8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  return;
}

Assistant:

TEST(PrintfTest, Examples) {
  const char *weekday = "Thursday";
  const char *month = "August";
  int day = 21;
  EXPECT_WRITE(stdout, fmt::printf("%1$s, %3$d %2$s", weekday, month, day),
               "Thursday, 21 August");
}